

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_CutDsdBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  If_DsdMan_t *p_00;
  uint uVar1;
  int iVar2;
  If_Obj_t *pIVar3;
  char *pPermLits;
  ulong uVar4;
  int Area;
  int pTimes [15];
  uint local_6c;
  int local_68 [16];
  
  uVar1 = *(uint *)&pCut->field_0x1c | 0x2000;
  *(uint *)&pCut->field_0x1c = uVar1;
  if (vAig != (Vec_Int_t *)0x0) {
    vAig->nSize = 0;
    uVar1 = *(uint *)&pCut->field_0x1c;
  }
  if (uVar1 < 0x1000000) {
    iVar2 = If_CutDsdLit(p,pCut);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 != 0) {
      __assert_fail("Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x91a,"int If_CutDsdBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      iVar2 = If_CutDsdLit(p,pCut);
      iVar2 = Abc_LitIsCompl(iVar2);
      Vec_IntPush(vAig,iVar2);
    }
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
    iVar2 = 0;
  }
  else if ((uVar1 & 0xff000000) == 0x1000000) {
    iVar2 = If_CutDsdLit(p,pCut);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 != 1) {
      __assert_fail("Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x922,"int If_CutDsdBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      Vec_IntPush(vAig,0);
      iVar2 = If_CutDsdLit(p,pCut);
      iVar2 = Abc_LitIsCompl(iVar2);
      Vec_IntPush(vAig,iVar2);
    }
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
    pIVar3 = If_CutLeaf(p,pCut,0);
    iVar2 = (int)(pIVar3->CutBest).Delay;
  }
  else {
    local_6c = 0;
    If_CutDsdPerm(p,pCut);
    for (uVar4 = 0; uVar4 < (byte)pCut->field_0x1f; uVar4 = uVar4 + 1) {
      pIVar3 = If_CutLeaf(p,pCut,(int)uVar4);
      local_68[uVar4] = (int)(pIVar3->CutBest).Delay;
    }
    p_00 = p->pIfDsdMan;
    iVar2 = If_CutDsdLit(p,pCut);
    iVar2 = Abc_LitNotCond(iVar2,*(uint *)&pCut->field_0x1c >> 0xc & 1);
    pPermLits = If_CutDsdPerm(p,pCut);
    iVar2 = If_CutDsdBalanceEvalInt(p_00,iVar2,local_68,vAig,(int *)&local_6c,pPermLits);
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | local_6c & 0xfff;
  }
  return iVar2;
}

Assistant:

int If_CutDsdBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    int fUseCofs = 0;
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutDsdLit(p, pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutDsdLit(p, pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        int Delay, Area = 0;
        char * pPermLits = If_CutDsdPerm(p, pCut);
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutDsdBalanceEvalInt( p->pIfDsdMan, Abc_LitNotCond(If_CutDsdLit(p, pCut), pCut->fCompl), pTimes, vAig, &Area, If_CutDsdPerm(p, pCut) );
        pCut->Cost = Area;
        // try cofactoring 
        if ( fUseCofs )
        {
            // count how many times the max one appears
            int iMax = 0, nCountMax = 1;
            for ( i = 1; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] > pTimes[iMax] )
                    iMax = i, nCountMax = 1;
                else if ( pTimes[i] == pTimes[iMax] )
                    nCountMax++;
            // decide when to try the decomposition
            if ( nCountMax == 1 && pTimes[iMax] + 2 < Delay && If_DsdManCheckNonTriv( p->pIfDsdMan, Abc_Lit2Var(If_CutDsdLit(p, pCut)), 
                 If_CutLeaveNum(pCut), If_CutDsdPermLitMax(pPermLits, If_CutLeaveNum(pCut), iMax)) )
            {
//                fVerbose = 1;
                Delay = pTimes[iMax] + 2;
            }
        }
        // report the result
        if ( fVerbose )
        {
/*
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
*/
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[Abc_Lit2Var(pPermLits[i])] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                If_DsdManPrintOne( stdout, p->pIfDsdMan, Abc_Lit2Var(If_CutDsdLit(p, pCut)), NULL, 0 );
                printf( "\n" );
            }
        }
        return Delay;
    }
}